

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLVariant.cpp
# Opt level: O0

bool Kernel::MLVariant_AUX::createLiteralBindings
               (Literal *baseLit,LiteralList *alts,Clause *instCl,uint **boundVarData,
               uint ***altBindingPtrs,uint **altBindingData)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  TermList base;
  TermList instance;
  TermList *pTVar6;
  long *in_RCX;
  List<Kernel::Literal_*> *in_RSI;
  Term *in_RDI;
  long *in_R8;
  long *in_R9;
  bool bVar7;
  Term *in_stack_00000010;
  Term *in_stack_00000018;
  ArrayStoringBinder binder_2;
  ArrayStoringBinder binder_1;
  ArrayStoringBinder binder;
  Literal *alit;
  Iterator ait;
  uint numVars;
  uint var_1;
  uint nextPos;
  uint var;
  VariableIterator bvit;
  undefined4 in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  ArrayStoringBinder *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  uint in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffeae;
  undefined2 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffeca;
  undefined1 in_stack_fffffffffffffecb;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  ArrayStoringBinder *in_stack_fffffffffffffee8;
  Term *in_stack_fffffffffffffef0;
  TermList in_stack_fffffffffffffef8;
  TermList in_stack_ffffffffffffff00;
  Term *in_stack_ffffffffffffff08;
  ArrayStoringBinder local_d8;
  ArrayStoringBinder local_c8;
  Term *local_b8;
  Iterator local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  TermList local_98;
  uint local_8c;
  long *local_30;
  long *local_28;
  long *local_20;
  List<Kernel::Literal_*> *local_10;
  Term *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
       ::variablePositions == '\0') &&
     (iVar3 = __cxa_guard_acquire(&createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
                                   ::variablePositions), iVar3 != 0)) {
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::DHMap
              (&createLiteralBindings::variablePositions);
    __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                 ,&createLiteralBindings::variablePositions,&__dso_handle);
    __cxa_guard_release(&createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
                         ::variablePositions);
  }
  if ((createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
       ::varNums == '\0') &&
     (iVar3 = __cxa_guard_acquire(&createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
                                   ::varNums), iVar3 != 0)) {
    Lib::BinaryHeap<unsigned_int,_Lib::Int>::BinaryHeap(&createLiteralBindings::varNums);
    __cxa_atexit(Lib::BinaryHeap<unsigned_int,_Lib::Int>::~BinaryHeap,
                 &createLiteralBindings::varNums,&__dso_handle);
    __cxa_guard_release(&createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
                         ::varNums);
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&createLiteralBindings::variablePositions);
  Lib::BinaryHeap<unsigned_int,_Lib::Int>::reset(&createLiteralBindings::varNums);
  VariableIterator::VariableIterator
            ((VariableIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (Term *)CONCAT44(in_stack_fffffffffffffecc,
                              CONCAT13(in_stack_fffffffffffffecb,
                                       CONCAT12(in_stack_fffffffffffffeca,in_stack_fffffffffffffec8)
                                      )));
  while (bVar1 = VariableIterator::hasNext
                           ((VariableIterator *)
                            CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)), bVar1) {
    local_98 = VariableIterator::next
                         ((VariableIterator *)
                          CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_8c = TermList::var(&local_98);
    Lib::BinaryHeap<unsigned_int,_Lib::Int>::insert
              ((BinaryHeap<unsigned_int,_Lib::Int> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
  }
  local_9c = 0;
  while (bVar1 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::isEmpty(&createLiteralBindings::varNums),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_a0 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::pop
                         ((BinaryHeap<unsigned_int,_Lib::Int> *)
                          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    while( true ) {
      bVar1 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::isEmpty(&createLiteralBindings::varNums);
      bVar7 = false;
      if (!bVar1) {
        puVar5 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::top(&createLiteralBindings::varNums);
        bVar7 = *puVar5 == local_a0;
      }
      if (!bVar7) break;
      Lib::BinaryHeap<unsigned_int,_Lib::Int>::pop
                ((BinaryHeap<unsigned_int,_Lib::Int> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    }
    bVar1 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
                      (in_stack_fffffffffffffe70,(uint)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (uint)in_stack_fffffffffffffe68);
    if (bVar1) {
      puVar5 = (uint *)*local_20;
      *local_20 = (long)(puVar5 + 1);
      *puVar5 = local_a0;
      local_9c = local_9c + 1;
    }
  }
  local_a4 = local_9c;
  Lib::List<Kernel::Literal_*>::Iterator::Iterator(&local_b0,local_10);
  while (bVar1 = Lib::List<Kernel::Literal_*>::Iterator::hasNext((Iterator *)0x8aad75), bVar1) {
    local_b8 = &Lib::List<Kernel::Literal_*>::Iterator::next
                          ((Iterator *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                          )->super_Term;
    uVar2 = Literal::isEquality((Literal *)0x8aadb6);
    if ((bool)uVar2) {
      in_stack_fffffffffffffeae =
           MatchingUtils::haveVariantArgs
                     (in_stack_ffffffffffffff08,(Term *)in_stack_ffffffffffffff00._content);
      if ((bool)in_stack_fffffffffffffeae) {
        ArrayStoringBinder::ArrayStoringBinder
                  (&local_c8,(uint *)*local_30,&createLiteralBindings::variablePositions);
        MatchingUtils::matchArgs<Kernel::MLVariant_AUX::ArrayStoringBinder>
                  ((Term *)in_stack_fffffffffffffef8._content,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
        *(long *)*local_28 = *local_30;
        *local_28 = *local_28 + 8;
        *local_30 = *local_30 + (ulong)local_a4 * 4;
        in_stack_fffffffffffffea8 =
             Clause::getLiteralPosition
                       ((Clause *)
                        CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffeae,
                                                CONCAT24(in_stack_fffffffffffffeac,
                                                         in_stack_fffffffffffffea8))),
                        (Literal *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
        puVar5 = (uint *)*local_30;
        *local_30 = (long)(puVar5 + 1);
        *puVar5 = in_stack_fffffffffffffea8;
      }
      in_stack_fffffffffffffea7 =
           MatchingUtils::haveReversedVariantArgs(in_stack_00000018,in_stack_00000010);
      if ((bool)in_stack_fffffffffffffea7) {
        ArrayStoringBinder::ArrayStoringBinder
                  (&local_d8,(uint *)*local_30,&createLiteralBindings::variablePositions);
        base._content = (uint64_t)Term::nthArgument(local_8,0);
        instance._content = (uint64_t)Term::nthArgument(local_b8,1);
        MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
                  (base,instance,in_stack_fffffffffffffe88);
        in_stack_fffffffffffffe88 = (ArrayStoringBinder *)Term::nthArgument(local_8,1);
        pTVar6 = Term::nthArgument(local_b8,0);
        in_stack_ffffffffffffff08 = (Term *)pTVar6->_content;
        MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
                  (base,instance,in_stack_fffffffffffffe88);
        bVar1 = Term::isTwoVarEquality(local_8);
        if (bVar1) {
          in_stack_ffffffffffffff00 = Literal::twoVarEqSort((Literal *)local_8);
          in_stack_fffffffffffffef8 = Literal::twoVarEqSort((Literal *)local_b8);
          MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
                    (base,instance,in_stack_fffffffffffffe88);
        }
        *(long *)*local_28 = *local_30;
        *local_28 = *local_28 + 8;
        *local_30 = *local_30 + (ulong)local_a4 * 4;
        in_stack_fffffffffffffe64 =
             Clause::getLiteralPosition
                       ((Clause *)
                        CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffeae,
                                                CONCAT24(in_stack_fffffffffffffeac,
                                                         in_stack_fffffffffffffea8))),
                        (Literal *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
        puVar5 = (uint *)*local_30;
        *local_30 = (long)(puVar5 + 1);
        *puVar5 = in_stack_fffffffffffffe64;
      }
    }
    else {
      if (local_a4 != 0) {
        ArrayStoringBinder::ArrayStoringBinder
                  ((ArrayStoringBinder *)&stack0xfffffffffffffee8,(uint *)*local_30,
                   &createLiteralBindings::variablePositions);
        bVar1 = MatchingUtils::matchArgs<Kernel::MLVariant_AUX::ArrayStoringBinder>
                          ((Term *)in_stack_fffffffffffffef8._content,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffee8);
        in_stack_fffffffffffffe60 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe60);
      }
      *(long *)*local_28 = *local_30;
      *local_28 = *local_28 + 8;
      *local_30 = *local_30 + (ulong)local_a4 * 4;
      uVar4 = Clause::getLiteralPosition
                        ((Clause *)
                         CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffeae,
                                                 CONCAT24(in_stack_fffffffffffffeac,
                                                          in_stack_fffffffffffffea8))),
                         (Literal *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      puVar5 = (uint *)*local_30;
      *local_30 = (long)(puVar5 + 1);
      *puVar5 = uVar4;
    }
  }
  VariableIterator::~VariableIterator
            ((VariableIterator *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  return true;
}

Assistant:

bool createLiteralBindings(Literal* baseLit, LiteralList* alts, Clause* instCl,
    unsigned*& boundVarData, unsigned**& altBindingPtrs, unsigned*& altBindingData)
{
  static UUMap variablePositions;
  static BinaryHeap<unsigned,Int> varNums;
  variablePositions.reset();
  varNums.reset();

  VariableIterator bvit(baseLit);
  while(bvit.hasNext()) {
    unsigned var=bvit.next().var();
    varNums.insert(var);
  }

  unsigned nextPos=0;
  while(!varNums.isEmpty()) {
    unsigned var=varNums.pop();
    while(!varNums.isEmpty() && varNums.top()==var) {
      varNums.pop();
    }
    if(variablePositions.insert(var,nextPos)) {
      *(boundVarData++)=var;
      nextPos++;
    }
  }
  unsigned numVars=nextPos;

  LiteralList::Iterator ait(alts);
  while(ait.hasNext()) {
    //handle multiple matches in equality!
    Literal* alit=ait.next();
    if(alit->isEquality()) {
      //we must try both possibilities
      if(MatchingUtils::haveVariantArgs(baseLit,alit)) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        MatchingUtils::matchArgs(baseLit,alit,binder);
        *altBindingPtrs=altBindingData;
        altBindingPtrs++;
        altBindingData+=numVars;

        //add pointer to the literal at
        //the end of the binding sequence
        *(altBindingData++)=instCl->getLiteralPosition(alit);
      }
      if(MatchingUtils::haveReversedVariantArgs(baseLit, alit)) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        MatchingUtils::matchTerms(*baseLit->nthArgument(0),*alit->nthArgument(1),binder);
        MatchingUtils::matchTerms(*baseLit->nthArgument(1),*alit->nthArgument(0),binder);
        if(baseLit->isTwoVarEquality()){
          ASS(alit->isTwoVarEquality());
          MatchingUtils::matchTerms(baseLit->twoVarEqSort(),alit->twoVarEqSort(),binder);
        } //matchArgs automatically matches the sorts of literals if one is a twoVarEq literal
          //This is the reason for the difference between the two cases.
        *altBindingPtrs=altBindingData;
        altBindingPtrs++;
        altBindingData+=numVars;

        //add pointer to the literal at
        //the end of the binding sequence
        *(altBindingData++)=instCl->getLiteralPosition(alit);
      }

    } else {
      if(numVars) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        ALWAYS(MatchingUtils::matchArgs(baseLit,alit,binder));
      }

      *altBindingPtrs=altBindingData;
      altBindingPtrs++;
      altBindingData+=numVars;

      //add index of the literal in instance clause at
      //the end of the binding sequence
      *(altBindingData++) = (size_t)instCl->getLiteralPosition(alit);
    }
  }
  return true;
}